

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall
higan::HttpServer::OnHttpRequest(HttpServer *this,TcpConnectionPtr *connection,HttpRequest *request)

{
  bool bVar1;
  int iVar2;
  HttpVersion HVar3;
  FileForReadPtr *file_ptr_;
  bool close_connection;
  undefined1 local_e8 [8];
  HttpResponse response;
  Buffer send_buffer;
  string connection_flag;
  
  local_e8 = (undefined1  [8])&response.header_map_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Connection","");
  HttpRequest::operator[]((string *)&send_buffer.write_idx_,request,(string *)local_e8);
  if (local_e8 != (undefined1  [8])&response.header_map_) {
    operator_delete((void *)local_e8,response.header_map_._M_t._M_impl._0_8_ + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&send_buffer.write_idx_);
  if (iVar2 == 0) {
    close_connection = true;
  }
  else {
    HVar3 = HttpRequest::GetVersion(request);
    if (HVar3 == HTTP_VERSION_10) {
      iVar2 = std::__cxx11::string::compare((char *)&send_buffer.write_idx_);
      close_connection = iVar2 != 0;
    }
    else {
      close_connection = false;
    }
  }
  HttpResponse::HttpResponse((HttpResponse *)local_e8,close_connection);
  if ((this->on_http_request_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->on_http_request_)._M_invoker)
              ((_Any_data *)&this->on_http_request_,connection,request,(HttpResponse *)local_e8);
  }
  Buffer::Buffer((Buffer *)
                 &response.file_ptr_.
                  super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  HttpResponse::EncodeToBuffer
            ((HttpResponse *)local_e8,
             (Buffer *)
             &response.file_ptr_.super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TcpConnection::Send((connection->
                      super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      (Buffer *)
                      &response.file_ptr_.
                       super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  bVar1 = HttpResponse::HasFileToResponse((HttpResponse *)local_e8);
  if (bVar1) {
    file_ptr_ = HttpResponse::GetFilePtr((HttpResponse *)local_e8);
    SendFile(this,connection,file_ptr_,close_connection);
  }
  else if (close_connection != false) {
    TcpConnection::DestroyConnection
              ((connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
  }
  Buffer::~Buffer((Buffer *)
                  &response.file_ptr_.
                   super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  HttpResponse::~HttpResponse((HttpResponse *)local_e8);
  if ((size_type *)send_buffer.write_idx_ != &connection_flag._M_string_length) {
    operator_delete((void *)send_buffer.write_idx_,connection_flag._M_string_length + 1);
  }
  return;
}

Assistant:

void HttpServer::OnHttpRequest(const TcpConnectionPtr& connection, HttpRequest& request)
{
	std::string connection_flag = request["Connection"];

	// 原本的 keep_connection逻辑写起来有点麻烦 换为了跟muduo一样的判断 close
	// 而且只有当连接为close的时候才需要进行特殊操作
	bool close_connection = connection_flag == "close" ||
			(request.GetVersion() == HttpRequest::HTTP_VERSION_10
			&& connection_flag != "Keep-Alive");

	HttpResponse response(close_connection);

	if (on_http_request_)
	{
		on_http_request_(connection, request, response);
	}

	Buffer send_buffer;
	response.EncodeToBuffer(&send_buffer);
	connection->Send(&send_buffer);

	if (!response.HasFileToResponse())
	{
		if (close_connection)
		{
			connection->DestroyConnection();
		}
	}
	else
	{
		SendFile(connection, response.GetFilePtr(), close_connection);
	}
}